

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ustring.cpp
# Opt level: O0

UChar * u_strFindLast_63(UChar *s,int32_t length,UChar *sub,int32_t subLength)

{
  UChar *pUVar1;
  UChar *pUVar2;
  UChar c_00;
  UChar *pUVar3;
  UBool UVar4;
  int iVar5;
  UChar *pUVar6;
  UChar *local_68;
  UChar cs;
  UChar c;
  UChar *subLimit;
  UChar *q;
  UChar *p;
  UChar *limit;
  UChar *start;
  int32_t subLength_local;
  UChar *sub_local;
  int32_t length_local;
  UChar *s_local;
  
  s_local = s;
  if ((sub != (UChar *)0x0) && (-2 < subLength)) {
    if ((s == (UChar *)0x0) || (length < -1)) {
      s_local = (UChar *)0x0;
    }
    else {
      start._4_4_ = subLength;
      if (subLength < 0) {
        start._4_4_ = u_strlen_63(sub);
      }
      if (start._4_4_ != 0) {
        c_00 = (sub + start._4_4_)[-1];
        iVar5 = start._4_4_ + -1;
        if ((iVar5 == 0) && ((c_00 & 0xf800U) != 0xd800)) {
          if (length < 0) {
            local_68 = u_strrchr_63(s,c_00);
          }
          else {
            local_68 = u_memrchr_63(s,c_00,length);
          }
          s_local = local_68;
        }
        else {
          sub_local._4_4_ = length;
          if (length < 0) {
            sub_local._4_4_ = u_strlen_63(s);
          }
          if (iVar5 < sub_local._4_4_) {
            pUVar6 = s + sub_local._4_4_;
            do {
              do {
                p = pUVar6;
                if (s + iVar5 == p) {
                  return (UChar *)0x0;
                }
                pUVar6 = p + -1;
                q = pUVar6;
                pUVar3 = sub + start._4_4_;
              } while (p[-1] != c_00);
              do {
                subLimit = pUVar3 + -1;
                if (subLimit == sub) {
                  UVar4 = isMatchAtCPBoundary(s,q,p,s + sub_local._4_4_);
                  if (UVar4 != '\0') {
                    return q;
                  }
                  break;
                }
                pUVar1 = q + -1;
                pUVar2 = pUVar3 + -2;
                q = q + -1;
                pUVar3 = subLimit;
              } while (*pUVar1 == *pUVar2);
            } while( true );
          }
          s_local = (UChar *)0x0;
        }
      }
    }
  }
  return s_local;
}

Assistant:

U_CAPI UChar * U_EXPORT2
u_strFindLast(const UChar *s, int32_t length,
              const UChar *sub, int32_t subLength) {
    const UChar *start, *limit, *p, *q, *subLimit;
    UChar c, cs;

    if(sub==NULL || subLength<-1) {
        return (UChar *)s;
    }
    if(s==NULL || length<-1) {
        return NULL;
    }

    /*
     * This implementation is more lazy than the one for u_strFindFirst():
     * There is no special search code for NUL-terminated strings.
     * It does not seem to be worth it for searching substrings to
     * search forward and find all matches like in u_strrchr() and similar.
     * Therefore, we simply get both string lengths and search backward.
     *
     * markus 2002oct23
     */

    if(subLength<0) {
        subLength=u_strlen(sub);
    }
    if(subLength==0) {
        return (UChar *)s;
    }

    /* get sub[subLength-1] to search for it fast */
    subLimit=sub+subLength;
    cs=*(--subLimit);
    --subLength;

    if(subLength==0 && !U16_IS_SURROGATE(cs)) {
        /* the substring consists of a single, non-surrogate BMP code point */
        return length<0 ? u_strrchr(s, cs) : u_memrchr(s, cs, length);
    }

    if(length<0) {
        length=u_strlen(s);
    }

    /* subLength was decremented above */
    if(length<=subLength) {
        return NULL; /* s is shorter than sub */
    }

    start=s;
    limit=s+length;

    /* the substring must start no later than s+subLength */
    s+=subLength;

    while(s!=limit) {
        c=*(--limit);
        if(c==cs) {
            /* found last substring UChar, compare rest */
            p=limit;
            q=subLimit;
            for(;;) {
                if(q==sub) {
                    if(isMatchAtCPBoundary(start, p, limit+1, start+length)) {
                        return (UChar *)p; /* well-formed match */
                    } else {
                        break; /* no match because surrogate pair is split */
                    }
                }
                if(*(--p)!=*(--q)) {
                    break; /* no match */
                }
            }
        }
    }

    /* not found */
    return NULL;
}